

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

istream * __thiscall nivalis::Plotter::import_binary_render_result(Plotter *this,istream *is)

{
  pointer pDVar1;
  pointer pPVar2;
  size_t i;
  ulong uVar3;
  size_t i_1;
  long lVar4;
  bool loss_detail_tmp;
  string func_error_tmp;
  
  util::
  resize_from_read_bin<std::vector<nivalis::DrawBufferObject,std::allocator<nivalis::DrawBufferObject>>>
            (is,&this->draw_buf);
  lVar4 = 0;
  for (uVar3 = 0;
      pDVar1 = (this->draw_buf).
               super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->draw_buf).
                            super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 7);
      uVar3 = uVar3 + 1) {
    DrawBufferObject::from_bin((DrawBufferObject *)((long)(pDVar1->c).data + lVar4 + -0x20),is);
    lVar4 = lVar4 + 0x80;
  }
  util::resize_from_read_bin<std::vector<nivalis::PointMarker,std::allocator<nivalis::PointMarker>>>
            (is,&this->pt_markers);
  lVar4 = 0;
  for (uVar3 = 0;
      pPVar2 = (this->pt_markers).
               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->pt_markers).
                             super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x38);
      uVar3 = uVar3 + 1) {
    util::read_bin<nivalis::PointMarker>(is,(PointMarker *)((long)&pPVar2->x + lVar4));
    lVar4 = lVar4 + 0x38;
  }
  func_error_tmp._M_dataplus._M_p = (pointer)&func_error_tmp.field_2;
  func_error_tmp._M_string_length = 0;
  func_error_tmp.field_2._M_local_buf[0] = '\0';
  util::resize_from_read_bin<std::__cxx11::string>(is,&func_error_tmp);
  std::istream::read((char *)is,(long)func_error_tmp._M_dataplus._M_p);
  util::read_bin<bool>(is,&loss_detail_tmp);
  if (loss_detail_tmp == true) {
    std::__cxx11::string::_M_assign((string *)&this->func_error);
  }
  else if (this->loss_detail == true) {
    (this->func_error)._M_string_length = 0;
    *(this->func_error)._M_dataplus._M_p = '\0';
  }
  this->loss_detail = loss_detail_tmp;
  this->require_update = true;
  std::__cxx11::string::~string((string *)&func_error_tmp);
  return is;
}

Assistant:

std::istream& Plotter::import_binary_render_result(std::istream& is) {
    util::resize_from_read_bin(is, draw_buf);
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        draw_buf[i].from_bin(is);
    }
    util::resize_from_read_bin(is, pt_markers);
    for (size_t i = 0; i < pt_markers.size(); ++i) {
        util::read_bin(is, pt_markers[i]);
    }
    std::string func_error_tmp;
    util::resize_from_read_bin(is, func_error_tmp);
    is.read(&func_error_tmp[0], func_error_tmp.size());
    bool loss_detail_tmp;
    util::read_bin(is, loss_detail_tmp);
    if (loss_detail_tmp) {
        func_error = func_error_tmp;
    } else if (loss_detail) {
        func_error.clear();
    }
    loss_detail = loss_detail_tmp;
    require_update = true;
    return is;
}